

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_custom_storage(void)

{
  uint __line;
  bool bVar1;
  reference_type pbVar2;
  char *__assertion;
  undefined1 local_b0 [8];
  opt_str os_;
  undefined1 local_68 [8];
  opt_str os0;
  opt_str osA;
  
  string_in_pair_empty_val::empty_value_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)
             (os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
              field_2._M_local_buf + 8),"",
             (allocator *)
             (os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
              field_2._M_local_buf + 8));
  string_in_pair_empty_val::store_value
            ((storage_type *)local_68,
             (value_type *)
             ((long)&os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                     second.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             (os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
              field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             (os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
              field_2._M_local_buf + 8),"A",
             (allocator *)
             (osA.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
              field_2._M_local_buf + 0xf));
  string_in_pair_empty_val::store_value
            ((storage_type *)
             ((long)&os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                     second.field_2 + 8),
             (value_type *)
             ((long)&os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                     second.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             (os_.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
              field_2._M_local_buf + 8));
  if (local_b0[0] == false) {
    if (local_68[0] == false) {
      __assertion = "os0.has_value()";
      __line = 0x57;
    }
    else {
      pbVar2 = ak_toolbox::compact_optional_ns::detail_::
               compact_optional_base<string_in_pair_empty_val>::value_abi_cxx11_
                         ((compact_optional_base<string_in_pair_empty_val> *)local_68);
      bVar1 = std::operator==(pbVar2,"");
      if (bVar1) {
        if (os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.second.
            field_2._M_local_buf[8] == '\0') {
          __assertion = "osA.has_value()";
          __line = 0x5a;
        }
        else {
          pbVar2 = ak_toolbox::compact_optional_ns::detail_::
                   compact_optional_base<string_in_pair_empty_val>::value_abi_cxx11_
                             ((compact_optional_base<string_in_pair_empty_val> *)
                              ((long)&os0.super_compact_optional_base<string_in_pair_empty_val>.
                                      super_type.value_.second.field_2 + 8));
          bVar1 = std::operator==(pbVar2,"A");
          if (bVar1) {
            std::
            pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::swap((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b0,
                   (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_68);
            if (local_b0[0] == false) {
              __assertion = "os_.has_value()";
              __line = 0x5f;
            }
            else {
              pbVar2 = ak_toolbox::compact_optional_ns::detail_::
                       compact_optional_base<string_in_pair_empty_val>::value_abi_cxx11_
                                 ((compact_optional_base<string_in_pair_empty_val> *)local_b0);
              bVar1 = std::operator==(pbVar2,"");
              if (bVar1) {
                if (local_68[0] == false) {
                  std::__cxx11::string::~string((string *)&osA);
                  std::__cxx11::string::~string((string *)&os0);
                  std::__cxx11::string::~string((string *)&os_);
                  return;
                }
                __assertion = "!os0.has_value()";
                __line = 0x61;
              }
              else {
                __assertion = "os_.value() == \"\"";
                __line = 0x60;
              }
            }
          }
          else {
            __assertion = "osA.value() == \"A\"";
            __line = 0x5b;
          }
        }
      }
      else {
        __assertion = "os0.value() == \"\"";
        __line = 0x58;
      }
    }
  }
  else {
    __assertion = "!os_.has_value()";
    __line = 0x55;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,__line,"void test_custom_storage()");
}

Assistant:

void test_custom_storage()
{
  typedef compact_optional<string_in_pair_empty_val> opt_str;
  opt_str os_, os0(std::string("\0")), osA(std::string("A"));
  
  assert (!os_.has_value());
  
  assert (os0.has_value());
  assert (os0.value() == "");
  
  assert (osA.has_value());
  assert (osA.value() == "A");

  swap (os_, os0);
    
  assert (os_.has_value());
  assert (os_.value() == "");
  assert (!os0.has_value());
}